

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

my_rational my_rational_product(my_rational *a,my_rational *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  _Bool _Var4;
  wchar_t wVar5;
  size_t sVar6;
  size_t sVar7;
  my_rational mVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint t;
  int iVar15;
  uint16_t q_u16n [2];
  uint16_t a_u16n [2];
  uint16_t d_u16n [4];
  uint16_t b_u16n [2];
  uint16_t r_u16n [6];
  uint16_t n_u16n [4];
  uint16_t w_u16n [5];
  uint16_t sr_u16n [6];
  
  uVar12 = a->n;
  uVar13 = b->d;
  while (uVar13 != 0) {
    uVar9 = uVar12 % uVar13;
    uVar12 = uVar13;
    uVar13 = uVar9;
  }
  uVar13 = b->n;
  uVar9 = a->d;
  uVar14 = uVar13;
  while (uVar14 != 0) {
    uVar10 = uVar9 % uVar14;
    uVar9 = uVar14;
    uVar14 = uVar10;
  }
  uVar11 = (ulong)a->n / (ulong)uVar12;
  uVar1 = (ulong)a->d / (ulong)uVar9;
  uVar2 = (ulong)uVar13 / (ulong)uVar9;
  uVar3 = (ulong)b->d / (ulong)uVar12;
  uVar14 = (uint)uVar11;
  uVar12 = (uint)uVar1;
  if (((uVar13 < uVar9) || ((int)(uVar2 * uVar11 >> 0x20) == 0)) &&
     ((int)(uVar3 * uVar1 >> 0x20) == 0)) {
    mVar8.n = (int)uVar2 * uVar14;
    mVar8.d = 0;
    uVar11 = (ulong)((int)uVar3 * uVar12);
  }
  else {
    a_u16n = (uint16_t  [2])(uVar14 >> 0x10 | uVar14 << 0x10);
    b_u16n[1] = (uint16_t)uVar2;
    b_u16n[0] = (uint16_t)(uVar2 >> 0x10);
    _Var4 = mul_u16n(n_u16n,a_u16n,b_u16n,4,2,2);
    if (_Var4) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x73f,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    a_u16n = (uint16_t  [2])(uVar12 >> 0x10 | uVar12 << 0x10);
    b_u16n[1] = (uint16_t)uVar3;
    b_u16n[0] = (uint16_t)(uVar3 >> 0x10);
    _Var4 = mul_u16n(d_u16n,a_u16n,b_u16n,4,2,2);
    if (_Var4) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x74c,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    wVar5 = div_u16n(q_u16n,r_u16n,w_u16n,n_u16n,d_u16n,2,4,4);
    uVar12 = 1;
    uVar13 = 0xffffffff;
    if ((wVar5 == L'\0') && (sVar6 = msb_u16n(q_u16n,2), sVar6 < 0x21)) {
      iVar15 = CONCAT22(q_u16n[0],q_u16n[1]);
      if (iVar15 == -1) {
        uVar12 = 1;
      }
      else {
        uVar12 = (uint)(0xffffffff / (ulong)(iVar15 + 1));
      }
      a_u16n = (uint16_t  [2])(uVar12 >> 0x10 | uVar12 << 0x10);
      _Var4 = mul_u16n(sr_u16n,r_u16n,a_u16n,6,4,2);
      if (_Var4) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x762,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      wVar5 = div_u16n(q_u16n,r_u16n,w_u16n,sr_u16n,d_u16n,2,6,4);
      if (wVar5 != L'\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x767,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      sVar6 = msb_u16n(q_u16n,2);
      if (0x20 < sVar6) {
        __assert_fail("msb_u16n(q_u16n, MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x76a,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      uVar13 = CONCAT22(q_u16n[0],q_u16n[1]) + iVar15 * uVar12;
      if (CARRY4(CONCAT22(q_u16n[0],q_u16n[1]),iVar15 * uVar12)) {
        __assert_fail("rn <= UINT_MAX - t",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x76c,
                      "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                     );
      }
      sVar6 = msb_u16n(r_u16n,6);
      sVar7 = msb_u16n(d_u16n,4);
      if (sVar7 <= sVar6 + 1) {
        if (uVar13 == 0xffffffff) {
          __assert_fail("rn < UINT_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x771,
                        "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                       );
        }
        uVar13 = uVar13 + 1;
      }
    }
    mVar8 = my_rational_construct(uVar13,uVar12);
    uVar11 = (ulong)mVar8 >> 0x20;
  }
  return (my_rational)((ulong)mVar8 & 0xffffffff | uVar11 << 0x20);
}

Assistant:

struct my_rational my_rational_product(const struct my_rational *a,
		const struct my_rational *b)
{
	unsigned int g1 = gcd(a->n, b->d);
	unsigned int g2 = gcd(a->d, b->n);
	unsigned int anr = a->n / g1;
	unsigned int adr = a->d / g2;
	unsigned int bnr = b->n / g2;
	unsigned int bdr = b->d / g1;
	struct my_rational result;

	if ((bnr && anr > UINT_MAX / bnr) || (adr > UINT_MAX / bdr)) {
		/* Overflows in native arithmetic so approximate. */
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
		uint16_t a_u16n[MP_DIGITS], b_u16n[MP_DIGITS];
		uint16_t n_u16n[2 * MP_DIGITS], d_u16n[2 * MP_DIGITS];
		uint16_t q_u16n[MP_DIGITS], r_u16n[3 * MP_DIGITS];
		uint16_t sr_u16n[3 * MP_DIGITS], w_u16n[2 * MP_DIGITS + 1];
		unsigned int rn, rd;
		bool over;

		over = ini_u16n(a_u16n, MP_DIGITS, anr);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, bnr);
		if (over) {
			assert(0);
		}
		over = mul_u16n(n_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = ini_u16n(a_u16n, MP_DIGITS, adr);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, bdr);
		if (over) {
			assert(0);
		}
		over = mul_u16n(d_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = (div_u16n(q_u16n, r_u16n, w_u16n, n_u16n, d_u16n,
			MP_DIGITS, 2 * MP_DIGITS, 2 * MP_DIGITS) != 0);
		if (!over && msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT) {
			unsigned int t;

			rn = ext_u16n(q_u16n, MP_DIGITS);
			/*
			 * Use as large as possible of a denominator so the
			 * approximation is as accurate as possible.
			 */
			rd = (rn < UINT_MAX) ? UINT_MAX / (rn + 1) : 1;
			rn *= rd;
			over = ini_u16n(a_u16n, MP_DIGITS, rd);
			if (over) {
				assert(0);
			}
			over = mul_u16n(sr_u16n, r_u16n, a_u16n, 3 * MP_DIGITS,
				2 * MP_DIGITS, MP_DIGITS);
			if (over) {
				assert(0);
			}
			over = div_u16n(q_u16n, r_u16n, w_u16n, sr_u16n, d_u16n,
				MP_DIGITS, 3 * MP_DIGITS, 2 * MP_DIGITS);
			if (over) {
				assert(0);
			}
			assert(msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT);
			t = ext_u16n(q_u16n, MP_DIGITS);
			assert(rn <= UINT_MAX - t);
			rn += t;
			/* Approximate rounding to the nearest. */
			if (msb_u16n(r_u16n, 3 * MP_DIGITS) + 1
					>= msb_u16n(d_u16n, 2 * MP_DIGITS)) {
				assert(rn < UINT_MAX);
				++rn;
			}
		} else {
			rn = UINT_MAX;
			rd = 1;
		}
		return my_rational_construct(rn, rd);
#undef MP_DIGITS
	}
	result.n = anr * bnr;
	result.d = adr * bdr;
	return result;
}